

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVector<slang::syntax::UdpEntrySyntax_*,_5UL>::SmallVector
          (SmallVector<slang::syntax::UdpEntrySyntax_*,_5UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>).firstElement;
  (this->super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>).len = 0;
  (this->super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>).cap = 5;
  SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::reserve
            (&this->super_SmallVectorBase<slang::syntax::UdpEntrySyntax_*>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }